

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KvsCommandHandler.hpp
# Opt level: O2

void __thiscall
supermap::cli::ContainsKeyHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>::
ContainsKeyHandler(ContainsKeyHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>
                   *this,shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
                         *kvs)

{
  allocator<char> local_59;
  shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
  local_58;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Check if key in keys",&local_59);
  local_58.
  super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (kvs->
            super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  local_58.
  super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (kvs->
       super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
       )._M_refcount._M_pi;
  (kvs->
  super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
  )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (kvs->
  super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
  )._M_ptr = (element_type *)0x0;
  KvsCommandHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>::KvsCommandHandler
            (&this->
              super_KvsCommandHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,
             &local_40,1,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.
              super___shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_KvsCommandHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>).
  super_Handler._vptr_Handler = (_func_int **)&PTR_handle_00128b60;
  return;
}

Assistant:

explicit ContainsKeyHandler(std::shared_ptr<KeyValueStorage<Key, Value, Index>> kvs)
        : KvsCommandHandler<Key, Value, Index>("Check if key in keys", 1, std::move(kvs)) {}